

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int GetVoltageSSC32(SSC32 *pSSC32,int channel,double *pVoltage)

{
  int iVar1;
  size_t sVar2;
  char local_235;
  uchar v;
  char c;
  int recvbuflen;
  uint8 local_228 [3];
  char recvbuf [1];
  int sendbuflen;
  char sendbuf [512];
  double *pVoltage_local;
  int channel_local;
  SSC32 *pSSC32_local;
  
  recvbuflen = 0;
  switch(channel) {
  case 0:
    local_235 = 'A';
    break;
  case 1:
    local_235 = 'B';
    break;
  case 2:
    local_235 = 'C';
    break;
  case 3:
    local_235 = 'D';
    break;
  default:
    printf("Invalid parameter : channel %d.\n",(ulong)(uint)channel);
    return 1;
  }
  memset(local_228,0,0x200);
  sprintf((char *)local_228,"V%c\r",(ulong)(uint)(int)local_235);
  sVar2 = strlen((char *)local_228);
  recvbuflen = (int)sVar2;
  iVar1 = WriteDataSSC32(pSSC32,local_228,recvbuflen,pSSC32->bytedelayus);
  if (iVar1 == 0) {
    if ((pSSC32->bSaveRawData != 0) && (pSSC32->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_228,(long)recvbuflen,1,(FILE *)pSSC32->pfSaveFile);
      fflush((FILE *)pSSC32->pfSaveFile);
    }
    memset(&c,0,1);
    iVar1 = ReadAllRS232Port(&pSSC32->RS232Port,(uint8 *)&c,1);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && (pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(&c,1,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      *pVoltage = ((double)(byte)c * 5.0) / 256.0;
      pSSC32_local._4_4_ = 0;
    }
    else {
      printf("Error reading data from a SSC32. \n");
      pSSC32_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a SSC32. \n");
    pSSC32_local._4_4_ = 1;
  }
  return pSSC32_local._4_4_;
}

Assistant:

inline int GetVoltageSSC32(SSC32* pSSC32, int channel, double* pVoltage)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	char recvbuf[1];
	int recvbuflen = 0;
	char c = 0;
	unsigned char v = 0;

	switch (channel)
	{
	case 0: c = 'A'; break;
	case 1: c = 'B'; break;
	case 2: c = 'C'; break;
	case 3: c = 'D'; break;
	default: 
		printf("Invalid parameter : channel %d.\n", channel);
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "V%c\r", c);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 1;

	if (ReadAllRS232Port(&pSSC32->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	v = (unsigned char)recvbuf[0];
	*pVoltage = v*5.0/256.0;

	return EXIT_SUCCESS;
}